

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathNative.cpp
# Opt level: O0

void chatra::emb::math::math_abs(Ct *ct)

{
  uint uVar1;
  int iVar2;
  NativeReference *pNVar3;
  undefined4 extraout_var;
  IllegalArgumentException *this;
  Ct *ct_local;
  
  pNVar3 = NativeCallContext::operator[](ct,0);
  uVar1 = (*pNVar3->_vptr_NativeReference[4])();
  if ((uVar1 & 1) == 0) {
    pNVar3 = NativeCallContext::operator[](ct,0);
    uVar1 = (*pNVar3->_vptr_NativeReference[5])();
    if ((uVar1 & 1) == 0) {
      this = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
      IllegalArgumentException::IllegalArgumentException
                (this,"passing argument has non-numeric value");
      __cxa_throw(this,&IllegalArgumentException::typeinfo,
                  IllegalArgumentException::~IllegalArgumentException);
    }
    pNVar3 = NativeCallContext::operator[](ct,0);
    (*pNVar3->_vptr_NativeReference[0xc])();
    std::abs((int)pNVar3);
    (*ct->_vptr_NativeCallContext[0xf])();
  }
  else {
    pNVar3 = NativeCallContext::operator[](ct,0);
    iVar2 = (*pNVar3->_vptr_NativeReference[0xb])();
    iVar2 = std::abs(iVar2);
    (*ct->_vptr_NativeCallContext[0xe])(ct,CONCAT44(extraout_var,iVar2));
  }
  return;
}

Assistant:

static void math_abs(Ct& ct) {
	if (ct[0].isInt())
		ct.setInt(std::abs(ct[0].getInt()));
	else if (ct[0].isFloat())
		ct.setFloat(std::abs(ct[0].getFloat()));
	else
		throw IllegalArgumentException("passing argument has non-numeric value");
}